

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFx.c
# Opt level: O0

Vec_Wec_t * Gia_ManFxRetrieve(Gia_Man_t *p,Vec_Str_t **pvCompl,int fReverse)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  Vec_Wrd_t *p_00;
  Vec_Int_t *p_01;
  Vec_Wec_t *p_02;
  Vec_Str_t *pVVar7;
  Gia_Obj_t *pGVar8;
  int *piVar9;
  word *puTruth;
  Vec_Int_t *pVVar10;
  Gia_Obj_t *pGVar11;
  int *piVar12;
  int Status;
  word *pTruth;
  int *pVars;
  int nVars;
  Gia_Obj_t *pObj;
  int Counter;
  int Cube;
  int Lit;
  int v;
  int c;
  int i;
  int nWords;
  int nCutSize;
  int nItems;
  Vec_Int_t *vCover;
  Vec_Int_t *vCube;
  Vec_Wrd_t *vTruths;
  Vec_Wec_t *vCubes;
  int fReverse_local;
  Vec_Str_t **pvCompl_local;
  Gia_Man_t *p_local;
  
  pObj._4_4_ = 0;
  iVar1 = Gia_ManAssignNumbers(p);
  iVar2 = Gia_ManLutSizeMax(p);
  iVar3 = Abc_Truth6WordNum(iVar2);
  iVar4 = Gia_ManCiNum(p);
  p_00 = Gia_ManComputeTruths(p,iVar2,iVar1 - iVar4,fReverse);
  p_01 = Vec_IntAlloc(0x10000);
  p_02 = Vec_WecAlloc(1000);
  pVVar7 = Vec_StrStart(iVar1);
  *pvCompl = pVVar7;
  v = 1;
  do {
    iVar1 = Gia_ManObjNum(p);
    if (iVar1 <= v) {
      iVar1 = Vec_WrdSize(p_00);
      if (pObj._4_4_ * iVar3 == iVar1) {
        Vec_WrdFree(p_00);
        Vec_IntFree(p_01);
        return p_02;
      }
      __assert_fail("Counter * nWords == Vec_WrdSize(vTruths)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFx.c"
                    ,0xef,"Vec_Wec_t *Gia_ManFxRetrieve(Gia_Man_t *, Vec_Str_t **, int)");
    }
    iVar1 = Gia_ObjIsLut(p,v);
    if (iVar1 != 0) {
      pGVar8 = Gia_ManObj(p,v);
      iVar1 = Gia_ObjLutSize(p,v);
      piVar9 = Gia_ObjLutFanins(p,v);
      iVar2 = pObj._4_4_ + 1;
      puTruth = Vec_WrdEntryP(p_00,pObj._4_4_ * iVar3);
      iVar4 = Kit_TruthIsop((uint *)puTruth,iVar1,p_01,1);
      iVar5 = Vec_IntSize(p_01);
      pObj._4_4_ = iVar2;
      if ((iVar5 == 0) ||
         ((iVar2 = Vec_IntSize(p_01), iVar2 == 1 && (iVar2 = Vec_IntEntry(p_01,0), iVar2 == 0)))) {
        pVVar7 = *pvCompl;
        uVar6 = pGVar8->Value;
        iVar1 = Vec_IntSize(p_01);
        Vec_StrWriteEntry(pVVar7,uVar6,iVar1 == 0);
        pVVar10 = Vec_WecPushLevel(p_02);
        Vec_IntPush(pVVar10,pGVar8->Value);
      }
      else {
        Vec_StrWriteEntry(*pvCompl,pGVar8->Value,(char)iVar4);
        for (Lit = 0; iVar2 = Vec_IntSize(p_01), Lit < iVar2; Lit = Lit + 1) {
          iVar2 = Vec_IntEntry(p_01,Lit);
          pVVar10 = Vec_WecPushLevel(p_02);
          Vec_IntPush(pVVar10,pGVar8->Value);
          for (Cube = 0; Cube < iVar1; Cube = Cube + 1) {
            uVar6 = iVar2 >> ((byte)(Cube << 1) & 0x1f) & 3;
            if (uVar6 == 1) {
              pGVar11 = Gia_ManObj(p,piVar9[Cube]);
              iVar4 = Abc_Var2Lit(pGVar11->Value,1);
              Vec_IntPush(pVVar10,iVar4);
            }
            else if (uVar6 == 2) {
              pGVar11 = Gia_ManObj(p,piVar9[Cube]);
              iVar4 = Abc_Var2Lit(pGVar11->Value,0);
              Vec_IntPush(pVVar10,iVar4);
            }
            else if (uVar6 != 0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaFx.c"
                            ,0xea,"Vec_Wec_t *Gia_ManFxRetrieve(Gia_Man_t *, Vec_Str_t **, int)");
            }
          }
          piVar12 = Vec_IntArray(pVVar10);
          iVar2 = Vec_IntSize(pVVar10);
          Vec_IntSelectSort(piVar12 + 1,iVar2 + -1);
        }
      }
    }
    v = v + 1;
  } while( true );
}

Assistant:

Vec_Wec_t * Gia_ManFxRetrieve( Gia_Man_t * p, Vec_Str_t ** pvCompl, int fReverse )
{
    Vec_Wec_t * vCubes;
    Vec_Wrd_t * vTruths;
    Vec_Int_t * vCube, * vCover;
    int nItems, nCutSize, nWords;
    int i, c, v, Lit, Cube, Counter = 0;
//    abctime clk = Abc_Clock();
    nItems = Gia_ManAssignNumbers( p );
    // compute truth tables
    nCutSize = Gia_ManLutSizeMax( p );
    nWords = Abc_Truth6WordNum( nCutSize );
    vTruths = Gia_ManComputeTruths( p, nCutSize, nItems - Gia_ManCiNum(p), fReverse );
    vCover = Vec_IntAlloc( 1 << 16 );
    // collect cubes
    vCubes = Vec_WecAlloc( 1000 );
    *pvCompl = Vec_StrStart( nItems );
    Gia_ManForEachLut( p, i )
    {
        Gia_Obj_t * pObj = Gia_ManObj( p, i );
        int nVars = Gia_ObjLutSize( p, i );
        int * pVars = Gia_ObjLutFanins( p, i );
        word * pTruth = Vec_WrdEntryP( vTruths, Counter++ * nWords );
        int Status = Kit_TruthIsop( (unsigned *)pTruth, nVars, vCover, 1 );
        if ( Vec_IntSize(vCover) == 0 || (Vec_IntSize(vCover) == 1 && Vec_IntEntry(vCover,0) == 0) )
        {
            Vec_StrWriteEntry( *pvCompl, pObj->Value, (char)(Vec_IntSize(vCover) == 0) );
            vCube = Vec_WecPushLevel( vCubes );
            Vec_IntPush( vCube, pObj->Value );
            continue;
        }
        Vec_StrWriteEntry( *pvCompl, pObj->Value, (char)Status );
        Vec_IntForEachEntry( vCover, Cube, c )
        {
            vCube = Vec_WecPushLevel( vCubes );
            Vec_IntPush( vCube, pObj->Value );
            for ( v = 0; v < nVars; v++ )
            {
                Lit = 3 & (Cube >> (v << 1));
                if ( Lit == 1 )
                    Vec_IntPush( vCube, Abc_Var2Lit(Gia_ManObj(p, pVars[v])->Value, 1) );
                else if ( Lit == 2 )
                    Vec_IntPush( vCube, Abc_Var2Lit(Gia_ManObj(p, pVars[v])->Value, 0) );
                else if ( Lit != 0 )
                    assert( 0 );
            }
            Vec_IntSelectSort( Vec_IntArray(vCube) + 1, Vec_IntSize(vCube) - 1 );
        }        
    }
    assert( Counter * nWords == Vec_WrdSize(vTruths) );
    Vec_WrdFree( vTruths );
    Vec_IntFree( vCover );
//    Abc_PrintTime( 1, "Setup time", Abc_Clock() - clk );
    return vCubes;
}